

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

ANNpoint annAllocPt(int dim,ANNcoord c)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ANNpoint pAVar3;
  int in_EDI;
  ANNcoord in_XMM0_Qa;
  int i;
  ANNpoint p;
  int local_1c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pAVar3 = (ANNpoint)operator_new__(uVar2);
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    pAVar3[local_1c] = in_XMM0_Qa;
  }
  return pAVar3;
}

Assistant:

ANNpoint annAllocPt(int dim, ANNcoord c)  // allocate 1 point
{
    ANNpoint p = new ANNcoord[dim];
    for (int i = 0; i < dim; i++) p[i] = c;
    return p;
}